

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_d_coef_controller *pjVar3;
  jpeg_component_info *pjVar4;
  inverse_DCT_method_ptr p_Var5;
  uint uVar6;
  boolean bVar7;
  int local_74;
  inverse_DCT_method_ptr inverse_DCT;
  jpeg_component_info *compptr;
  JDIMENSION output_col;
  JDIMENSION start_col;
  JSAMPARRAY output_ptr;
  int local_48;
  int useful_width;
  int yoffset;
  int yindex;
  int xindex;
  int ci;
  int blkn;
  JDIMENSION last_iMCU_row;
  JDIMENSION last_MCU_col;
  JDIMENSION MCU_col_num;
  my_coef_ptr coef;
  JSAMPIMAGE output_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->coef;
  uVar6 = cinfo->MCUs_per_row - 1;
  JVar1 = cinfo->total_iMCU_rows;
  local_48 = *(int *)((long)&pjVar3[1].start_input_pass + 4);
  do {
    if (*(int *)&pjVar3[1].consume_data <= local_48) {
      cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
      uVar6 = cinfo->input_iMCU_row + 1;
      cinfo->input_iMCU_row = uVar6;
      if (uVar6 < cinfo->total_iMCU_rows) {
        start_iMCU_row(cinfo);
        cinfo_local._4_4_ = 3;
      }
      else {
        (*cinfo->inputctl->finish_input_pass)(cinfo);
        cinfo_local._4_4_ = 4;
      }
      return cinfo_local._4_4_;
    }
    for (last_iMCU_row = *(JDIMENSION *)&pjVar3[1].start_input_pass; last_iMCU_row <= uVar6;
        last_iMCU_row = last_iMCU_row + 1) {
      if (cinfo->lim_Se != 0) {
        memset(pjVar3[1].start_output_pass,0,(long)cinfo->blocks_in_MCU << 7);
      }
      bVar7 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar3[1].start_output_pass);
      if (bVar7 == 0) {
        *(int *)((long)&pjVar3[1].start_input_pass + 4) = local_48;
        *(JDIMENSION *)&pjVar3[1].start_input_pass = last_iMCU_row;
        return 0;
      }
      xindex = 0;
      for (yindex = 0; yindex < cinfo->comps_in_scan; yindex = yindex + 1) {
        pjVar4 = cinfo->cur_comp_info[yindex];
        if (pjVar4->component_needed == 0) {
          xindex = pjVar4->MCU_blocks + xindex;
        }
        else {
          p_Var5 = cinfo->idct->inverse_DCT[pjVar4->component_index];
          if (last_iMCU_row < uVar6) {
            local_74 = pjVar4->MCU_width;
          }
          else {
            local_74 = pjVar4->last_col_width;
          }
          _output_col = output_buf[pjVar4->component_index] + local_48 * pjVar4->DCT_v_scaled_size;
          iVar2 = pjVar4->MCU_sample_width;
          for (useful_width = 0; useful_width < pjVar4->MCU_height; useful_width = useful_width + 1)
          {
            if ((cinfo->input_iMCU_row < JVar1 - 1) ||
               (local_48 + useful_width < pjVar4->last_row_height)) {
              compptr._0_4_ = last_iMCU_row * iVar2;
              for (yoffset = 0; yoffset < local_74; yoffset = yoffset + 1) {
                (*p_Var5)(cinfo,pjVar4,(JCOEFPTR)(&pjVar3[1].start_output_pass)[xindex + yoffset],
                          _output_col,(JDIMENSION)compptr);
                compptr._0_4_ = pjVar4->DCT_h_scaled_size + (JDIMENSION)compptr;
              }
            }
            xindex = pjVar4->MCU_width + xindex;
            _output_col = _output_col + pjVar4->DCT_v_scaled_size;
          }
        }
      }
    }
    *(undefined4 *)&pjVar3[1].start_input_pass = 0;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

METHODDEF(int)
decompress_onepass (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      if (cinfo->lim_Se)	/* can bypass in DC only case */
	FMEMZERO((void FAR *) coef->MCU_buffer[0],
		 (size_t) (cinfo->blocks_in_MCU * SIZEOF(JBLOCK)));
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
      /* Determine where data should go in output_buf and do the IDCT thing.
       * We skip dummy blocks at the right and bottom edges (but blkn gets
       * incremented past them!).  Note the inner loop relies on having
       * allocated the MCU_buffer[] blocks sequentially.
       */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	/* Don't bother to IDCT an uninteresting component. */
	if (! compptr->component_needed) {
	  blkn += compptr->MCU_blocks;
	  continue;
	}
	inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
	useful_width = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						    : compptr->last_col_width;
	output_ptr = output_buf[compptr->component_index] +
	  yoffset * compptr->DCT_v_scaled_size;
	start_col = MCU_col_num * compptr->MCU_sample_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (cinfo->input_iMCU_row < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    output_col = start_col;
	    for (xindex = 0; xindex < useful_width; xindex++) {
	      (*inverse_DCT) (cinfo, compptr,
			      (JCOEFPTR) coef->MCU_buffer[blkn+xindex],
			      output_ptr, output_col);
	      output_col += compptr->DCT_h_scaled_size;
	    }
	  }
	  blkn += compptr->MCU_width;
	  output_ptr += compptr->DCT_v_scaled_size;
	}
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}